

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
read_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
         char *filename,long offset,size_t bytes)

{
  undefined8 uVar1;
  _Ios_Iostate __a;
  streamoff sVar2;
  allocator<unsigned_char> local_252;
  undefined1 local_251;
  fpos local_250 [16];
  int local_240;
  int byte_count_file;
  long local_230;
  ifstream input;
  size_type local_28;
  size_t bytes_local;
  long offset_local;
  char *filename_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  
  std::ifstream::ifstream(&local_230);
  uVar1 = *(undefined8 *)(local_230 + -0x18);
  __a = std::operator|(_S_eofbit,_S_failbit);
  std::operator|(__a,_S_badbit);
  std::ios::exceptions((int)&local_230 + (int)uVar1);
  std::operator|(_S_in,_S_bin);
  std::ifstream::open((char *)&local_230,(_Ios_Openmode)filename);
  std::istream::seekg((long)&local_230,_S_beg);
  local_250 = (fpos  [16])std::istream::tellg();
  sVar2 = std::fpos::operator_cast_to_long(local_250);
  local_240 = (int)sVar2;
  std::istream::seekg((long)&local_230,(_Ios_Seekdir)offset);
  bytes_local = offset;
  if (offset < 0) {
    assert::is_true(bytes != 0);
    bytes_local = (long)local_240 - bytes;
  }
  local_28 = bytes;
  if (bytes == 0) {
    local_28 = (long)local_240 - bytes_local;
  }
  local_251 = 0;
  std::allocator<unsigned_char>::allocator(&local_252);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,local_28,&local_252);
  std::allocator<unsigned_char>::~allocator(&local_252);
  read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((istream *)&local_230,__return_storage_ptr__);
  local_251 = 1;
  std::ifstream::~ifstream(&local_230);
  return __return_storage_ptr__;
}

Assistant:

vector<uint8_t> read_file(const char* filename, long offset, size_t bytes)
{
    ifstream input;
    input.exceptions(ios::eofbit | ios::failbit | ios::badbit);
    input.open(filename, ios::in | ios::binary);

    input.seekg(0, ios::end);
    const auto byte_count_file{static_cast<int>(input.tellg())};
    input.seekg(offset, ios::beg);

    if (offset < 0)
    {
        assert::is_true(bytes != 0);
        offset = static_cast<long>(byte_count_file - bytes);
    }
    if (bytes == 0)
    {
        bytes = static_cast<size_t>(byte_count_file) - offset;
    }

    vector<uint8_t> buffer(bytes);
    read(input, buffer);

    return buffer;
}